

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

void buffer_remove(BUFFER *buf,size_t off,size_t n)

{
  ulong uVar1;
  size_t __n;
  long lVar2;
  void *__dest;
  ulong alloc;
  
  __n = buf->size - (n + off);
  if (n + off <= buf->size && __n != 0) {
    __dest = (void *)(off + (long)buf->data);
    memmove(__dest,(void *)((long)__dest + n),__n);
    off = buf->size - n;
  }
  buf->size = off;
  if (off == 0) {
    free(buf->data);
    buf->data = (void *)0x0;
    buf->alloc = 0;
  }
  else if (off < buf->alloc >> 2) {
    if (off < 0x81) {
      uVar1 = 0x10;
      do {
        alloc = uVar1;
        uVar1 = alloc * 2;
      } while (alloc < off * 2);
    }
    else {
      lVar2 = 0x200;
      do {
        alloc = lVar2 - 0x20;
        lVar2 = lVar2 * 2;
      } while (alloc < off * 2);
    }
    if (alloc < buf->alloc >> 1) {
      buffer_realloc(buf,alloc);
      return;
    }
  }
  return;
}

Assistant:

void
buffer_remove(BUFFER* buf, size_t off, size_t n)
{
    if(off + n < buf->size) {
        memmove((uint8_t*)buf->data + off, (uint8_t*)buf->data + off + n, buf->size - off - n);
        buf->size -= n;
    } else {
        buf->size = off;
    }

    if(buf->size == 0) {
        free(buf->data);
        buf->data = NULL;
        buf->alloc = 0;
    } else if(buf->size < buf->alloc / 4) {
        size_t new_alloc = buffer_good_alloc_size(buf->size * 2);
        if(new_alloc < buf->alloc / 2) {
            /* No error checking here: If the realloc fails, we still have valid
             * albeit bloated buffer. */
            buffer_realloc(buf, new_alloc);
        }
    }
}